

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::saveSettings(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  int iVar1;
  QVariant *pQVar2;
  QHeaderView *this_01;
  Type *pTVar3;
  char *pcVar4;
  long lVar5;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *this_02;
  QString *path;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QLatin1String local_d0;
  undefined1 local_c0 [16];
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<QString> local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s((QString *)&local_58,L"QtProject",9);
  local_88.d = (Data *)0x0;
  local_88.ptr = (QString *)0x0;
  local_88.size = 0;
  QSettings::QSettings
            ((QSettings *)&local_68,UserScope,(QString *)&local_58,(QString *)&local_88,
             (QObject *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])0x66b0f3);
  QVar6.m_size = (size_t)"FileDialog";
  QVar6.field_0.m_data_utf8 = (char *)&local_68;
  QSettings::beginGroup(QVar6);
  if (((this->super_QDialogPrivate).nativeDialogInUse == false) &&
     ((this->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
    pQVar2 = (QVariant *)QtPrivate::lengthHelperContainer<char,13ul>((char (*) [13])"sidebarWidth");
    QSplitter::sizes((QList<int> *)&local_88,((this->qFileDialogUi).d)->splitter);
    ::QVariant::QVariant(&local_58,*(int *)&((local_88.ptr)->d).d);
    QVar7.m_size = (size_t)"sidebarWidth";
    QVar7.field_0.m_data = &local_68;
    QSettings::setValue(QVar7,pQVar2);
    ::QVariant::~QVariant(&local_58);
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_88);
    pQVar2 = (QVariant *)QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])"shortcuts");
    QSidebar::urls((QList<QUrl> *)&local_a8,((this->qFileDialogUi).d)->sidebar);
    QUrl::toStringList(&local_88,&local_a8,0);
    ::QVariant::QVariant(&local_58,(QList_conflict *)&local_88);
    QVar8.m_size = (size_t)"shortcuts";
    QVar8.field_0.m_data = &local_68;
    QSettings::setValue(QVar8,pQVar2);
    ::QVariant::~QVariant(&local_58);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_a8);
    pQVar2 = (QVariant *)
             QtPrivate::lengthHelperContainer<char,15ul>((char (*) [15])"treeViewHeader");
    this_01 = QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
    QHeaderView::saveState((QByteArray *)&local_88,this_01);
    ::QVariant::QVariant(&local_58,(QByteArray *)&local_88);
    QVar9.m_size = (size_t)"treeViewHeader";
    QVar9.field_0.m_data = &local_68;
    QSettings::setValue(QVar9,pQVar2);
    ::QVariant::~QVariant(&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (QString *)0x0;
  local_88.size = 0;
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialog::history((QStringList *)&local_a8,this_00);
  QList<QString>::reserve((QList<QString> *)&local_88,local_a8.size);
  for (lVar5 = local_a8.size * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
    QUrl::fromLocalFile((QString *)local_c0);
    QUrl::toString((QArrayDataPointer<char16_t> *)&local_58,(QUrl *)local_c0,0);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_88,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QUrl::~QUrl((QUrl *)local_c0);
  }
  pQVar2 = (QVariant *)QtPrivate::lengthHelperContainer<char,8ul>((char (*) [8])"history");
  ::QVariant::QVariant(&local_58,(QList_conflict *)&local_88);
  QVar10.m_size = (size_t)"history";
  QVar10.field_0.m_data_utf8 = (char *)&local_68;
  QSettings::setValue(QVar10,pQVar2);
  ::QVariant::~QVariant(&local_58);
  this_02 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *)
            0x66b245;
  pQVar2 = (QVariant *)QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x66b245);
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
           operator()(this_02);
  QUrl::toString((QArrayDataPointer<char16_t> *)local_c0,pTVar3,0);
  ::QVariant::QVariant(&local_58,(QString *)local_c0);
  QVar11.m_size = (size_t)"lastVisited";
  QVar11.field_0.m_data_utf8 = (char *)&local_68;
  QSettings::setValue(QVar11,pQVar2);
  ::QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c0);
  iVar1 = (*(code *)**(undefined8 **)&(this_00->super_QDialog).super_QWidget)(this_00);
  pcVar4 = (char *)(*(code *)**(undefined8 **)&(this_00->super_QDialog).super_QWidget)(this_00);
  QMetaObject::indexOfEnumerator(pcVar4);
  local_c0 = QMetaObject::enumerator(iVar1);
  pQVar2 = (QVariant *)QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])"viewMode");
  QFileDialog::viewMode(this_00);
  pcVar4 = (char *)QMetaEnum::key((int)local_c0);
  QLatin1String::QLatin1String(&local_d0,pcVar4);
  ::QVariant::QVariant(&local_58,(QLatin1String *)local_d0.m_size);
  QVar12.m_size = (size_t)"viewMode";
  QVar12.field_0.m_data_utf8 = (char *)&local_68;
  QSettings::setValue(QVar12,pQVar2);
  ::QVariant::~QVariant(&local_58);
  pQVar2 = (QVariant *)QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])"qtVersion");
  ::QVariant::QVariant(&local_58,(QLatin1String *)0x6);
  QVar13.m_size = (size_t)"qtVersion";
  QVar13.field_0.m_data_utf8 = (char *)&local_68;
  QSettings::setValue(QVar13,pQVar2);
  ::QVariant::~QVariant(&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  QSettings::~QSettings((QSettings *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::saveSettings()
{
    Q_Q(QFileDialog);
    QSettings settings(QSettings::UserScope, u"QtProject"_s);
    settings.beginGroup("FileDialog");

    if (usingWidgets()) {
        settings.setValue("sidebarWidth", qFileDialogUi->splitter->sizes().constFirst());
        settings.setValue("shortcuts", QUrl::toStringList(qFileDialogUi->sidebar->urls()));
        settings.setValue("treeViewHeader", qFileDialogUi->treeView->header()->saveState());
    }
    QStringList historyUrls;
    const QStringList history = q->history();
    historyUrls.reserve(history.size());
    for (const QString &path : history)
        historyUrls << QUrl::fromLocalFile(path).toString();
    settings.setValue("history", historyUrls);
    settings.setValue("lastVisited", lastVisitedDir()->toString());
    const QMetaEnum &viewModeMeta = q->metaObject()->enumerator(q->metaObject()->indexOfEnumerator("ViewMode"));
    settings.setValue("viewMode", QLatin1StringView(viewModeMeta.key(q->viewMode())));
    settings.setValue("qtVersion", QT_VERSION_STR ""_L1);
}